

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O3

void __thiscall logging_tests::logging_LogPrintf_::test_method(logging_LogPrintf_ *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  Logger *pLVar4;
  istream *piVar5;
  long lVar6;
  iterator pvVar7;
  iterator pvVar8;
  long *plVar9;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_00;
  const_string msg;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  char *local_380;
  char *local_378;
  equal_coll_impl local_369;
  assertion_result local_368;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  string log;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  long *local_258 [2];
  long local_248 [2];
  ifstream file;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar4 = LogInstance();
  pLVar4->m_log_sourcelocations = true;
  source_file._M_str = "src1";
  source_file._M_len = 4;
  logging_function._M_str = "fn1";
  logging_function._M_len = 3;
  LogPrintf_<char[5]>(logging_function,source_file,1,NET,Debug,"foo1: %s\n",(char (*) [5])0xea796c);
  source_file_00._M_str = "src2";
  source_file_00._M_len = 4;
  logging_function_00._M_str = "fn2";
  logging_function_00._M_len = 3;
  LogPrintf_<char[5]>(logging_function_00,source_file_00,2,NET,Info,"foo2: %s\n",
                      (char (*) [5])0xea769e);
  source_file_01._M_str = "src3";
  source_file_01._M_len = 4;
  logging_function_01._M_str = "fn3";
  logging_function_01._M_len = 3;
  LogPrintf_<char[5]>(logging_function_01,source_file_01,3,ALL,Debug,"foo3: %s\n",
                      (char (*) [5])0xea798c);
  source_file_02._M_str = "src4";
  source_file_02._M_len = 4;
  logging_function_02._M_str = "fn4";
  logging_function_02._M_len = 3;
  LogPrintf_<char[5]>(logging_function_02,source_file_02,4,ALL,Info,"foo4: %s\n",
                      (char (*) [5])0xea76da);
  source_file_03._M_str = "src5";
  source_file_03._M_len = 4;
  logging_function_03._M_str = "fn5";
  logging_function_03._M_len = 3;
  LogPrintf_<char[5]>(logging_function_03,source_file_03,5,NONE,Debug,"foo5: %s\n",
                      (char (*) [5])0xea79bc);
  pvVar7 = (iterator)0x6;
  pvVar8 = (iterator)0x0;
  source_file_04._M_str = "src6";
  source_file_04._M_len = 4;
  logging_function_04._M_str = "fn6";
  logging_function_04._M_len = 3;
  LogPrintf_<char[5]>(logging_function_04,source_file_04,6,NONE,Info,"foo6: %s\n",
                      (char (*) [5])0xea7716);
  std::ifstream::ifstream
            ((istream *)&file,
             (this->super_LogSetup).tmp_log_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &log.field_2;
  log._M_string_length = 0;
  log.field_2._M_allocated_capacity = log.field_2._M_allocated_capacity & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(_file + -0x18) + (char)(istream *)&file);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&log,cVar3);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&log_lines,&log);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log._M_dataplus._M_p != paVar1) {
    operator_delete(log._M_dataplus._M_p,log.field_2._M_allocated_capacity + 1);
  }
  log._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&log,"[src1:1] [fn1] [net] foo1: bar1","");
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,"[src2:2] [fn2] [net:info] foo2: bar2","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,"[src3:3] [fn3] [debug] foo3: bar3","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,"[src4:4] [fn4] foo4: bar4","");
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"[src5:5] [fn5] [debug] foo5: bar5","");
  plVar9 = local_248;
  local_258[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_258,"[src6:6] [fn6] foo6: bar6","");
  __l._M_len = 6;
  __l._M_array = &log;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expected,__l,(allocator_type *)&local_368);
  lVar6 = -0xc0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6c;
  file_00.m_begin = (iterator)&local_340;
  msg.m_end = pvVar8;
  msg.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_350,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_368,&local_369,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  log._M_string_length = log._M_string_length & 0xffffffffffffff00;
  log._M_dataplus._M_p = "B";
  log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  log.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_378 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)&log,1,0xd,4,0xea771b,(size_t)&local_380,0x6c,
             "log_lines.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expected);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&log_lines);
  std::ifstream::~ifstream(&file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintf_, LogSetup)
{
    LogInstance().m_log_sourcelocations = true;
    LogPrintf_("fn1", "src1", 1, BCLog::LogFlags::NET, BCLog::Level::Debug, "foo1: %s\n", "bar1");
    LogPrintf_("fn2", "src2", 2, BCLog::LogFlags::NET, BCLog::Level::Info, "foo2: %s\n", "bar2");
    LogPrintf_("fn3", "src3", 3, BCLog::LogFlags::ALL, BCLog::Level::Debug, "foo3: %s\n", "bar3");
    LogPrintf_("fn4", "src4", 4, BCLog::LogFlags::ALL, BCLog::Level::Info, "foo4: %s\n", "bar4");
    LogPrintf_("fn5", "src5", 5, BCLog::LogFlags::NONE, BCLog::Level::Debug, "foo5: %s\n", "bar5");
    LogPrintf_("fn6", "src6", 6, BCLog::LogFlags::NONE, BCLog::Level::Info, "foo6: %s\n", "bar6");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "[src1:1] [fn1] [net] foo1: bar1",
        "[src2:2] [fn2] [net:info] foo2: bar2",
        "[src3:3] [fn3] [debug] foo3: bar3",
        "[src4:4] [fn4] foo4: bar4",
        "[src5:5] [fn5] [debug] foo5: bar5",
        "[src6:6] [fn6] foo6: bar6",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}